

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tap.c
# Opt level: O0

int find_mem_diff(char *a,char *b,size_t n,size_t *offset)

{
  ulong local_38;
  size_t i;
  size_t *offset_local;
  size_t n_local;
  char *b_local;
  char *a_local;
  
  if (a == b) {
    a_local._4_4_ = 0;
  }
  else if ((a == (char *)0x0) || (b == (char *)0x0)) {
    a_local._4_4_ = 2;
  }
  else {
    for (local_38 = 0; local_38 < n; local_38 = local_38 + 1) {
      if (a[local_38] != b[local_38]) {
        *offset = local_38;
        return 1;
      }
    }
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
find_mem_diff (const char *a, const char *b, size_t n, size_t *offset) {
    size_t i;
    if (a == b)
        return 0;
    if (!a || !b)
        return 2;
    for (i = 0; i < n; i++) {
        if (a[i] != b[i]) {
            *offset = i;
            return 1;
        }
    }
    return 0;
}